

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

void smf_rewind(smf_t *smf)

{
  int iVar1;
  smf_track_t *track;
  smf_event_t *psVar2;
  int track_number;
  
  if (smf == (smf_t *)0x0) {
    __assert_fail("smf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,900,"void smf_rewind(smf_t *)");
  }
  smf->last_seek_position = 0.0;
  track_number = 1;
  while( true ) {
    if (smf->number_of_tracks < track_number) {
      return;
    }
    track = smf_get_track_by_number(smf,track_number);
    if (track == (smf_track_t *)0x0) break;
    if (track->number_of_events < 1) {
      track->next_event_number = -1;
      iVar1 = 0;
    }
    else {
      track->next_event_number = 1;
      psVar2 = smf_peek_next_event_from_track(track);
      if (psVar2 == (smf_event_t *)0x0) {
        __assert_fail("event",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x390,"void smf_rewind(smf_t *)");
      }
      iVar1 = psVar2->time_pulses;
    }
    track->time_of_next_event = iVar1;
    track_number = track_number + 1;
  }
  __assert_fail("track != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x38b,"void smf_rewind(smf_t *)");
}

Assistant:

void
smf_rewind(smf_t *smf)
{
	int i;
	smf_track_t *track = NULL;
	smf_event_t *event;

	assert(smf);

	smf->last_seek_position = 0.0;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track != NULL);

		if (track->number_of_events > 0) {
			track->next_event_number = 1;
			event = smf_peek_next_event_from_track(track);
			assert(event);
			track->time_of_next_event = event->time_pulses;
		} else {
			track->next_event_number = -1;
			track->time_of_next_event = 0;
#if 0
			g_warning("Warning: empty track.");
#endif
		}
	}
}